

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

QJsonValue * __thiscall QJsonValue::operator=(QJsonValue *this,QJsonValue *other)

{
  Type TVar1;
  qint64 qVar2;
  QCborContainerPrivate *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QJsonValue((QJsonValue *)local_38,other);
  qVar2 = (this->value).n;
  (this->value).n = local_38._0_8_;
  pQVar3 = (this->value).container;
  (this->value).container = (QCborContainerPrivate *)local_38._8_8_;
  TVar1 = (this->value).t;
  (this->value).t = local_38._16_4_;
  local_38._16_4_ = TVar1;
  local_38._0_8_ = qVar2;
  local_38._8_8_ = pQVar3;
  ~QJsonValue((QJsonValue *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue &QJsonValue::operator =(const QJsonValue &other) noexcept
{
    QJsonValue copy(other);
    swap(copy);
    return *this;
}